

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_decoder.hpp
# Opt level: O1

void andyzip::brotli_decoder::inverse_move_to_front(uint8_t *values,int num_values)

{
  int i;
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint8_t local_108 [264];
  
  lVar1 = 0;
  do {
    local_108[lVar1] = (uint8_t)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x100);
  if (0 < num_values) {
    uVar2 = 0;
    do {
      uVar3 = (ulong)values[uVar2];
      local_108[0] = local_108[uVar3];
      values[uVar2] = local_108[0];
      if (uVar3 != 0) {
        uVar4 = uVar3 + 0xffffffff;
        do {
          uVar5 = uVar3 - 1;
          local_108[uVar3] = local_108[uVar4 & 0xffffffff];
          uVar4 = uVar4 - 1;
          uVar3 = uVar5;
        } while ((char)uVar5 != '\0');
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 != (uint)num_values);
  }
  return;
}

Assistant:

static void inverse_move_to_front(uint8_t values[], int num_values) {
      uint8_t mtf[256];
      for (int i = 0; i < 256; ++i) {
        mtf[i] = (uint8_t)i;
      }
      for (int i = 0; i < num_values; ++i) {
        uint8_t index = values[i];
        uint8_t value = mtf[index];
        values[i] = value;
        for (; index; --index) {
          mtf[index] = mtf[index - 1];
        }
        mtf[0] = value;
      }
    }